

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O1

int gmatch_aux(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  char *p;
  lua_Integer lVar3;
  char *e;
  char *s;
  size_t ls;
  MatchState ms;
  size_t local_258;
  MatchState local_250;
  
  pcVar2 = lua_tolstring(L,-0x2713,&local_258);
  p = lua_tolstring(L,-0x2714,(size_t *)0x0);
  local_250.src_end = pcVar2 + local_258;
  local_250.src_init = pcVar2;
  local_250.L = L;
  lVar3 = lua_tointeger(L,-0x2715);
  if (lVar3 <= (long)local_258) {
    s = pcVar2 + lVar3;
    do {
      local_250.level = 0;
      e = match(&local_250,s,p);
      if (e != (char *)0x0) {
        lua_pushinteger(L,(lua_Integer)(e + ((ulong)(s == e) - (long)pcVar2)));
        lua_replace(L,-0x2715);
        iVar1 = push_captures(&local_250,s,e);
        return iVar1;
      }
      s = s + 1;
    } while (s <= local_250.src_end);
  }
  return 0;
}

Assistant:

static int gmatch_aux (lua_State *L) {
  MatchState ms;
  size_t ls;
  const char *s = lua_tolstring(L, lua_upvalueindex(1), &ls);
  const char *p = lua_tostring(L, lua_upvalueindex(2));
  const char *src;
  ms.L = L;
  ms.src_init = s;
  ms.src_end = s+ls;
  for (src = s + (size_t)lua_tointeger(L, lua_upvalueindex(3));
       src <= ms.src_end;
       src++) {
    const char *e;
    ms.level = 0;
    if ((e = match(&ms, src, p)) != NULL) {
      lua_Integer newstart = e-s;
      if (e == src) newstart++;  /* empty match? go at least one position */
      lua_pushinteger(L, newstart);
      lua_replace(L, lua_upvalueindex(3));
      return push_captures(&ms, src, e);
    }
  }
  return 0;  /* not found */
}